

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envydis.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *pFVar5;
  void *__ptr;
  undefined1 uVar6;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  int local_558;
  char type;
  label *local_550;
  ulong local_548;
  ulong local_540;
  disisa *local_538;
  int local_530;
  uint limit;
  uint skip;
  uint base;
  char *local_520;
  undefined8 local_518;
  char *local_510;
  ull uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined8 local_4f8;
  FILE *local_4f0;
  label nl;
  char name [200];
  undefined1 uVar7;
  
  local_4f0 = _stdin;
  pcVar3 = __xpg_basename(*argv);
  *argv = pcVar3;
  sVar4 = strlen(pcVar3);
  uVar11 = (uint)sVar4;
  if ((3 < (int)uVar11) &&
     (iVar1 = strcmp(pcVar3 + ((ulong)(uVar11 & 0x7fffffff) - 3),"dis"), iVar1 == 0)) {
    pcVar3[uVar11 - 3] = '\0';
    local_538 = ed_getisa(*argv);
    if (local_538 != (disisa *)0x0) {
      local_548 = (ulong)(local_538->opunit == 4);
      goto LAB_001683da;
    }
  }
  local_548 = 0;
  local_538 = (disisa *)0x0;
LAB_001683da:
  base = 0;
  skip = 0;
  limit = 0;
  local_530 = 0;
  local_4f8 = 0;
  local_520 = (char *)0x0;
  iVar1 = 0;
  local_540 = 0;
  local_550 = (label *)0x0;
  local_558 = 0;
  uVar12 = 0xffffffff;
switchD_0016845c_caseD_4e:
  iVar2 = getopt(argc,argv,"vgfpcsb:d:l:m:V:wWinqu:M:");
  switch(iVar2) {
  case 0x4d:
    local_518 = uVar12;
    pFVar5 = fopen(_optarg,"r");
    if (pFVar5 == (FILE *)0x0) {
      main_cold_1();
      local_558 = 1;
      bVar17 = false;
    }
    else {
      memset(&nl,0,1000);
      do {
        do {
          pcVar3 = fgets((char *)&nl,1000,pFVar5);
          bVar17 = pcVar3 == (char *)0x0;
          if (bVar17) goto LAB_0016886f;
        } while (((char)nl.name == '#') || ((char)nl.name == '\n'));
        iVar2 = __isoc99_sscanf(&nl,"%c%llx%s%x",&type,&uStack_508,name,&uStack_4fc);
        if (iVar2 < 2) {
          fprintf(_stderr,"Malformated input: %s\n",&nl);
          iVar2 = 5;
        }
        else {
          switch(type) {
          case 'B':
            local_500 = 1;
            break;
          case 'C':
            local_500 = 2;
            break;
          case 'D':
            local_500 = 0x10;
            break;
          case 'E':
            local_500 = 4;
            break;
          default:
            if (type == 'N') {
              local_500 = 0x42;
            }
            else {
              if (type != 'S') {
                fprintf(_stderr,"Unknown label type %c\n",(ulong)(uint)(int)type);
                iVar2 = 1;
                local_558 = 1;
                goto LAB_00168710;
              }
              local_500 = 0x20;
            }
          }
          if (iVar2 < 4) {
            uStack_4fc = 0;
          }
          if (iVar2 == 2) {
            local_510 = (char *)0x0;
          }
          else {
            local_510 = strdup(name);
          }
          if (iVar1 <= (int)local_540) {
            bVar16 = iVar1 == 0;
            iVar1 = iVar1 * 2;
            if (bVar16) {
              iVar1 = 0x10;
            }
            local_550 = (label *)realloc(local_550,(long)iVar1 * 0x18);
          }
          iVar2 = (int)local_540;
          local_540 = (ulong)(iVar2 + 1);
          local_550[iVar2].type = local_500;
          local_550[iVar2].size = uStack_4fc;
          local_550[iVar2].name = local_510;
          local_550[iVar2].val = uStack_508;
          iVar2 = 0;
        }
LAB_00168710:
      } while ((iVar2 == 5) || (iVar2 == 0));
    }
LAB_0016886f:
    uVar12 = local_518;
    if (!bVar17) {
      return local_558;
    }
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x65:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x72:
  case 0x74:
    goto switchD_0016845c_caseD_4e;
  case 0x56:
    local_520 = _optarg;
    goto switchD_0016845c_caseD_4e;
  case 0x57:
    local_548 = 2;
    goto switchD_0016845c_caseD_4e;
  case 0x62:
    puVar9 = &base;
    break;
  case 99:
    uVar12 = 8;
    goto switchD_0016845c_caseD_4e;
  case 100:
    puVar9 = &skip;
    break;
  case 0x66:
  case 0x70:
    uVar12 = 4;
    goto switchD_0016845c_caseD_4e;
  case 0x67:
    uVar12 = 2;
    goto switchD_0016845c_caseD_4e;
  case 0x69:
    local_530 = 1;
    goto switchD_0016845c_caseD_4e;
  case 0x6c:
    puVar9 = &limit;
    break;
  case 0x6d:
    local_538 = ed_getisa(_optarg);
    if (local_538 == (disisa *)0x0) {
      main_cold_2();
      return 1;
    }
    goto switchD_0016845c_caseD_4e;
  case 0x6e:
    cnorm = "";
    cname = "";
    creg0 = "";
    creg1 = "";
    cmem = "";
    cnum = "";
    cunk = "";
    cbtarg = "";
    cctarg = "";
    cbctarg = "";
    goto switchD_0016845c_caseD_4e;
  case 0x71:
    local_4f8 = 1;
    goto switchD_0016845c_caseD_4e;
  case 0x73:
    uVar12 = 7;
    goto switchD_0016845c_caseD_4e;
  case 0x75:
    __isoc99_sscanf(_optarg,"%llx",&nl.val);
    nl.type = 1;
    nl.name = (char *)0x0;
    if (iVar1 <= (int)local_540) {
      bVar17 = iVar1 == 0;
      iVar1 = iVar1 * 2;
      if (bVar17) {
        iVar1 = 0x10;
      }
      local_550 = (label *)realloc(local_550,(long)iVar1 * 0x18);
    }
    iVar2 = (int)local_540;
    local_540 = (ulong)(iVar2 + 1);
    local_550[iVar2].type = nl.type;
    local_550[iVar2].size = nl.size;
    local_550[iVar2].name = nl.name;
    local_550[iVar2].val = nl.val;
    goto switchD_0016845c_caseD_4e;
  case 0x76:
    uVar12 = 1;
    goto switchD_0016845c_caseD_4e;
  case 0x77:
    local_548 = 1;
    goto switchD_0016845c_caseD_4e;
  default:
    goto switchD_0016845c_default;
  }
  __isoc99_sscanf(_optarg,"%x",puVar9);
  goto switchD_0016845c_caseD_4e;
switchD_0016845c_default:
  if (iVar2 == -1) goto LAB_00168889;
  goto switchD_0016845c_caseD_4e;
LAB_00168889:
  pFVar5 = local_4f0;
  if (_optind < argc) {
    pFVar5 = fopen(argv[_optind],"r");
    if (pFVar5 == (FILE *)0x0) {
      perror(argv[_optind]);
      return 1;
    }
    _optind = _optind + 1;
    if (_optind < argc) {
      main_cold_4();
      return 1;
    }
  }
  pcVar3 = local_520;
  if (local_538 == (disisa *)0x0) {
    main_cold_3();
    return 1;
  }
  if (local_520 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = ed_getvariant(local_538,local_520);
    if (iVar1 == 0) {
      fprintf(_stderr,"Unknown variant \"%s\"!\n",pcVar3);
      return 1;
    }
  }
  __ptr = malloc(0x10);
  local_520 = (char *)CONCAT44(local_520._4_4_,iVar1);
  if (local_530 == 0) {
    iVar1 = feof(pFVar5);
    if (iVar1 == 0) {
      iVar1 = 0x10;
      uVar15 = 0;
      local_518 = uVar12;
      do {
        iVar2 = __isoc99_fscanf(pFVar5,"%llx",&nl);
        if (iVar2 != 1) break;
        iVar2 = (int)uVar15;
        lVar13 = (long)iVar2;
        uVar10 = lVar13 + 3;
        if (iVar1 <= (int)uVar10) {
          iVar1 = iVar1 * 2;
          __ptr = realloc(__ptr,(long)iVar1);
        }
        uVar12 = local_518;
        uVar15 = lVar13 + 1;
        *(char *)((long)__ptr + lVar13) = (char)nl.name;
        if ((int)local_548 == 0) {
          uVar15 = uVar15 & 0xffffffff;
        }
        else {
          uVar6 = (undefined1)((ulong)nl.name >> 8);
          uVar7 = (undefined1)((ulong)nl.name >> 0x10);
          if ((int)local_548 == 2) {
            *(undefined1 *)((long)__ptr + uVar15) = uVar6;
            *(undefined1 *)(lVar13 + 2 + (long)__ptr) = uVar7;
            *(char *)((long)__ptr + uVar10) = (char)((ulong)nl.name >> 0x18);
            *(char *)(lVar13 + 4 + (long)__ptr) = (char)((ulong)nl.name >> 0x20);
            *(char *)(lVar13 + 5 + (long)__ptr) = (char)((ulong)nl.name >> 0x28);
            uVar10 = (ulong)(iVar2 + 7);
            *(char *)(lVar13 + 6 + (long)__ptr) = (char)((ulong)nl.name >> 0x30);
            iVar8 = 8;
            nl.name = (char *)((ulong)nl.name >> 0x30);
          }
          else {
            *(undefined1 *)((long)__ptr + uVar15) = uVar6;
            nl.name = (char *)((ulong)nl.name >> 0x10);
            *(undefined1 *)(lVar13 + 2 + (long)__ptr) = uVar7;
            iVar8 = 4;
          }
          uVar15 = (ulong)(uint)(iVar2 + iVar8);
          *(char *)((long)__ptr + (long)(int)uVar10) = (char)((ulong)nl.name >> 8);
          nl.name = (char *)((ulong)nl.name >> 8);
        }
        __isoc99_fscanf(pFVar5," ,");
        iVar2 = feof(pFVar5);
      } while (iVar2 == 0);
      goto LAB_001689bf;
    }
  }
  else {
    iVar1 = getc(pFVar5);
    if (iVar1 != -1) {
      iVar2 = 0x10;
      uVar15 = 0;
      do {
        if ((long)iVar2 <= (long)(uVar15 + 3)) {
          iVar2 = iVar2 * 2;
          __ptr = realloc(__ptr,(long)iVar2);
        }
        *(char *)((long)__ptr + uVar15) = (char)iVar1;
        uVar15 = uVar15 + 1;
        iVar1 = getc(pFVar5);
      } while (iVar1 != -1);
      goto LAB_001689bf;
    }
  }
  uVar15 = 0;
LAB_001689bf:
  if (skip < (uint)uVar15) {
    uVar14 = (uint)uVar15 - skip;
    uVar11 = uVar14;
    if (limit < uVar14) {
      uVar11 = limit;
    }
    if (limit == 0) {
      uVar11 = uVar14;
    }
    envydis(local_538,_stdout,(uint8_t *)((long)__ptr + (ulong)skip),base,uVar11,(int)local_520,
            (int)uVar12,(int)local_4f8,local_550,(int)local_540);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	FILE *infile = stdin;
	const struct disisa *isa = 0;
	struct label *labels = 0;
	int labelsnum = 0;
	int labelsmax = 0;
	int w = 0, bin = 0, quiet = 0;
	const char *varname = 0;
	argv[0] = basename(argv[0]);
	int len = strlen(argv[0]);
	if (len > 3 && !strcmp(argv[0] + len - 3, "dis")) {
		argv[0][len-3] = 0;
		isa = ed_getisa(argv[0]);
		if (isa && isa->opunit == 4)
			w = 1;
	}
	int ptype = -1;
	int vartype = -1;
	int c;
	unsigned base = 0, skip = 0, limit = 0;
	while ((c = getopt (argc, argv, "vgfpcsb:d:l:m:V:wWinqu:M:")) != -1)
		switch (c) {
			case 'v':
				ptype = VP;
				break;
			case 'g':
				ptype = GP;
				break;
			case 'f':
			case 'p':
				ptype = FP;
				break;
			case 'c':
				ptype = CP;
				break;
			case 's':
				ptype = VP|GP|FP;
				break;
			case 'b':
				sscanf(optarg, "%x", &base);
				break;
			case 'd':
				sscanf(optarg, "%x", &skip);
				break;
			case 'l':
				sscanf(optarg, "%x", &limit);
				break;
			case 'w':
				w = 1;
				break;
			case 'W':
				w = 2;
				break;
			case 'i':
				bin = 1;
				break;
			case 'q':
				quiet = 1;
				break;
			case 'n':
				cnorm = "";
				cname = "";
				creg0 = "";
				creg1 = "";
				cmem = "";
				cnum = "";
				cunk = "";
				cbtarg = "";
				cctarg = "";
				cbctarg = "";
				break;
			case 'm':
				isa = ed_getisa(optarg);
				if (!isa) {
					fprintf (stderr, "Unknown architecure \"%s\"!\n", optarg);
					return 1;
				}
				break;
			case 'V':
				varname = optarg;
				break;
			case 'M':
				{
					FILE *mapfile = fopen(optarg, "r");
					if (!mapfile) {
						perror(optarg);
						return 1;
					}
					struct label nl;
					char type;
					char buf[1000] = "";

					while(fgets(buf, sizeof(buf), mapfile)) {

						if (buf[0] == '#' || buf[0] == '\n')
							continue;

						char* tmp = strchr(buf, '#');
						if (tmp)
							tmp = '\0';

						char name[200];
						int comps = sscanf(buf, "%c%llx%s%x", &type, &nl.val, name, &nl.size);;
						if (comps < 2) {
							fprintf(stderr, "Malformated input: %s\n", buf);
							continue;
						}

						switch (type) {
							case 'B':
								nl.type = 1;
								break;
							case 'C':
								nl.type = 2;
								break;
							case 'E':
								nl.type = 4;
								break;
							case 'S':
								nl.type = 0x20;
								break;
							case 'N':
								nl.type = 0x42;
								break;
							case 'D':
								nl.type = 0x10;
								break;
							default:
								fprintf (stderr, "Unknown label type %c\n", type);
								return 1;
						}
						if (comps < 4)
							nl.size = 0;
						if (comps >= 3)
							nl.name = strdup(name);
						else
							nl.name = 0;
						ADDARRAY(labels, nl);
					}
					break;
				}
			case 'u':
				{
					struct label nl;
					sscanf(optarg, "%llx", &nl.val);
					nl.type = 1;
					nl.name = 0;
					ADDARRAY(labels, nl);
					break;
				}
		}
	if (optind < argc) {
		if (!(infile = fopen(argv[optind], "r"))) {
			perror(argv[optind]);
			return 1;
		}
		optind++;
		if (optind < argc) {
			fprintf (stderr, "Too many parameters!\n");
			return 1;
		}
	}
	if (!isa) {
		fprintf (stderr, "No architecture specified!\n");
		return 1;
	}
	if (varname) {
		vartype = ed_getvariant(isa, varname);
		if (!vartype) {
			fprintf (stderr, "Unknown variant \"%s\"!\n", varname);
			return 1;
		}
	}
	int num = 0;
	int maxnum = 16;
	uint8_t *code = malloc (maxnum);
	ull t;
	if (bin) {
		int c;
		while ((c = getc(infile)) != EOF) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			code[num++] = c;
		}
	} else {
		while (!feof(infile) && fscanf (infile, "%llx", &t) == 1) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			if (w == 2) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else if (w) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else
				code[num++] = t;
			fscanf (infile, " ,");
		}
	}
	if (num <= skip)
		return 0;
	int cnt = num - skip;
	if (limit && limit < cnt)
		cnt = limit;
	envydis (isa, stdout, code+skip, base, cnt, vartype, ptype, quiet, labels, labelsnum);
	return 0;
}